

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.cpp
# Opt level: O0

void __thiscall tcu::RGBA::RGBA(RGBA *this,Vec4 *v)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  float fVar5;
  deUint32 a;
  deUint32 b;
  deUint32 g;
  deUint32 r;
  Vec4 *v_local;
  RGBA *this_local;
  
  fVar5 = Vector<float,_4>::x(v);
  bVar1 = floatToU8(fVar5);
  fVar5 = Vector<float,_4>::y(v);
  bVar2 = floatToU8(fVar5);
  fVar5 = Vector<float,_4>::z(v);
  bVar3 = floatToU8(fVar5);
  fVar5 = Vector<float,_4>::w(v);
  bVar4 = floatToU8(fVar5);
  this->m_value = (uint)bVar4 << 0x18 | (uint)bVar1 | (uint)bVar2 << 8 | (uint)bVar3 << 0x10;
  return;
}

Assistant:

RGBA::RGBA (const Vec4& v)
{
	const deUint32 r = (deUint32)floatToU8(v.x());
	const deUint32 g = (deUint32)floatToU8(v.y());
	const deUint32 b = (deUint32)floatToU8(v.z());
	const deUint32 a = (deUint32)floatToU8(v.w());
	m_value = (a << ALPHA_SHIFT) | (r << RED_SHIFT) | (g << GREEN_SHIFT) | (b << BLUE_SHIFT);
}